

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O2

char * ON_ParseUuidString(char *sUUID,ON_UUID *uuid)

{
  char cVar1;
  endian eVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  uchar byte_value [2];
  anon_union_16_2_c96208d8 u;
  byte local_2a [2];
  ON_UUID local_28;
  
  if ((ON_ParseUuidString(char_const*,ON_UUID_struct*)::rho == '\0') &&
     (iVar4 = __cxa_guard_acquire(&ON_ParseUuidString(char_const*,ON_UUID_struct*)::rho), iVar4 != 0
     )) {
    eVar2 = ON::Endian();
    ON_ParseUuidString::rho = little_endian_rho;
    if (eVar2 == big_endian) {
      ON_ParseUuidString::rho = big_endian_rho;
    }
    __cxa_guard_release(&ON_ParseUuidString(char_const*,ON_UUID_struct*)::rho);
  }
  local_28.Data1 = 0;
  local_28.Data2 = 0;
  local_28.Data3 = 0;
  local_28.Data4[0] = '\0';
  local_28.Data4[1] = '\0';
  local_28.Data4[2] = '\0';
  local_28.Data4[3] = '\0';
  local_28.Data4[4] = '\0';
  local_28.Data4[5] = '\0';
  local_28.Data4[6] = '\0';
  local_28.Data4[7] = '\0';
  if (sUUID == (char *)0x0) {
LAB_0065ec14:
    local_28.Data1 = 0;
    local_28.Data2 = 0;
    local_28.Data3 = 0;
    local_28.Data4[0] = '\0';
    local_28.Data4[1] = '\0';
    local_28.Data4[2] = '\0';
    local_28.Data4[3] = '\0';
    local_28.Data4[4] = '\0';
    local_28.Data4[5] = '\0';
    local_28.Data4[6] = '\0';
    local_28.Data4[7] = '\0';
    sUUID = (char *)0x0;
  }
  else {
    for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
      local_2a[0] = 0;
      local_2a[1] = 0;
      iVar4 = 0;
      while (iVar4 < 2) {
        cVar1 = *sUUID;
        if (cVar1 == '\0') goto LAB_0065ec14;
        if ((byte)(cVar1 + 0xbfU) < 6) {
          bVar5 = cVar1 - 0x37;
LAB_0065ebd6:
          lVar6 = (long)iVar4;
          iVar4 = iVar4 + 1;
          local_2a[lVar6] = bVar5;
        }
        else {
          bVar5 = cVar1 - 0x30;
          if (bVar5 < 10) goto LAB_0065ebd6;
          if ((byte)(cVar1 + 0x9fU) < 6) {
            bVar5 = cVar1 + 0xa9;
            goto LAB_0065ebd6;
          }
          if (cVar1 != '-') goto LAB_0065ec14;
        }
        sUUID = sUUID + 1;
      }
      local_28.Data4[(long)ON_ParseUuidString::rho[lVar3] + -8] = local_2a[0] * '\x10' + local_2a[1]
      ;
    }
  }
  if (uuid != (ON_UUID *)0x0) {
    uuid->Data1 = local_28.Data1;
    uuid->Data2 = local_28.Data2;
    uuid->Data3 = local_28.Data3;
    *&uuid->Data4 = local_28.Data4;
  }
  return sUUID;
}

Assistant:

const char* ON_ParseUuidString(const char* sUUID, ON_UUID* uuid)
{
  // NOTE WELL: This code has to work on non-Windows OSs and on
  //            both big and little endian CPUs.  On Windows OSs
  //            is must return the same result as 
  //            Windows's UuidFromString().
  //

  // string has format like "85A08515-F383-11d3-BFE7-0010830122F0"
  // or like "85A08515-F383-11d3-BFE7-0010830122F0".
  // Hyphens are optional and ignored.
  //
  // Windows users can use "guidgen" to create UUID strings.

  /*
  #if defined(ON_DEBUG) && defined(ON_RUNTIME_WIN)
  RPC_STATUS st;
  union
  {
  ON_UUID uuid;
  unsigned char b[16];
  } u1;
  st = UuidFromString( (unsigned char*)sUUID, &u1.uuid );
  #endif
  */

  static const int* rho = (ON::endian::big_endian == ON::Endian())
    ? big_endian_rho
    : little_endian_rho;

  union
  {
    ON_UUID uuid;
    unsigned char b[16];
  } u;
  bool bFailed;
  int bi, ci;
  unsigned char c;
  unsigned char byte_value[2];

  memset(&u, 0, sizeof(u));
  //for ( bi = 0; bi < 16; bi++ ) 
  //  u.b[bi] = 0;

  bFailed = sUUID ? false : true;

  if (!bFailed)
  {
    for (bi = 0; bi < 16; bi++)
    {
      ci = 0;
      byte_value[0] = 0;
      byte_value[1] = 0;
      while (ci < 2)
      {
        c = *sUUID;
        if (!c) {
          bFailed = true;
          break;
        }
        if (c >= 'A' && c <= 'F') {
          byte_value[ci++] = (c - 'A' + 10);
        }
        else if (c >= '0' && c <= '9') {
          byte_value[ci++] = (c - '0');
        }
        else if (c >= 'a' && c <= 'f') {
          byte_value[ci++] = (c - 'a' + 10);
        }
        else if (c != '-') {
          bFailed = true;
          break;
        }
        sUUID++;
      }
      if (bFailed)
        break;
      u.b[rho[bi]] = 16 * byte_value[0] + byte_value[1];
    }
  }

  if (bFailed) 
  {
    // 09 August 2006 John Morse
    // There are times when Rhino is looking for a plug-in but the SDK or command
    // allows the plug-in to be specified by name or UUID.  Rhino calls ON_UuidFromString()
    // to see if the string is a plug-in UUID so it knows if it should be comparing the string
    // or plug-in name when looking for a plug-in.  The ON_ERROR line makes the Rhino commands
    // generate an OpenNURBS message box (in DEBUG builds) when the command completes and is
    // a pain so I commented it out per Dale Lear.
    //ON_ERROR("ON_UuidFromString(): bad string passed in");
    u.uuid = ON_nil_uuid;
  }

  if (uuid)
    *uuid = u.uuid;

  return bFailed ? 0 : sUUID;
}